

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::detail::resolveSymlink(path *p,error_code *ec)

{
  size_type __len;
  undefined8 *in_RDX;
  path *in_RDI;
  error_code eVar1;
  ssize_t rc;
  vector<char,_std::allocator<char>_> buffer;
  size_t bufferSize;
  char *in_stack_ffffffffffffff20;
  allocator_type *in_stack_ffffffffffffff28;
  allocator *in_stack_ffffffffffffff30;
  string_type *in_stack_ffffffffffffff38;
  path *in_stack_ffffffffffffff40;
  allocator local_91;
  string local_90 [36];
  int local_6c;
  int local_68;
  undefined4 uStack_64;
  error_category *local_60;
  allocator_type *local_58;
  allocator<char> local_3a;
  undefined1 local_39;
  vector<char,_std::allocator<char>_> local_38;
  long local_20;
  undefined8 *local_18;
  
  local_20 = 0x100;
  local_18 = in_RDX;
  do {
    local_39 = 0;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff40,
               (size_type)in_stack_ffffffffffffff38,(value_type_conflict *)in_stack_ffffffffffffff30
               ,in_stack_ffffffffffffff28);
    std::allocator<char>::~allocator(&local_3a);
    in_stack_ffffffffffffff38 = (string_type *)path::c_str((path *)0x13505a);
    in_stack_ffffffffffffff40 =
         (path *)std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x13506c);
    __len = std::vector<char,_std::allocator<char>_>::size(&local_38);
    local_58 = (allocator_type *)
               readlink((char *)in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff40,__len);
    if ((long)local_58 < 0) {
      eVar1 = make_system_error((int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      local_60 = eVar1._M_cat;
      local_68 = eVar1._M_value;
      *local_18 = CONCAT44(uStack_64,local_68);
      local_18[1] = local_60;
      path::path((path *)0x1350e2);
      local_6c = 1;
    }
    else if ((long)local_58 < (long)(int)local_20) {
      in_stack_ffffffffffffff20 =
           std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x13513e);
      in_stack_ffffffffffffff30 = &local_91;
      in_stack_ffffffffffffff28 = local_58;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_90,in_stack_ffffffffffffff20,(ulong)in_stack_ffffffffffffff28,
                 in_stack_ffffffffffffff30);
      path::path(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 (format)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      local_6c = 1;
    }
    else {
      local_20 = local_20 << 1;
      local_6c = 0;
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff30);
  } while (local_6c == 0);
  return in_RDI;
}

Assistant:

GHC_INLINE path resolveSymlink(const path& p, std::error_code& ec)
{
#ifdef GHC_OS_WINDOWS
#ifndef REPARSE_DATA_BUFFER_HEADER_SIZE
    typedef struct _REPARSE_DATA_BUFFER
    {
        ULONG ReparseTag;
        USHORT ReparseDataLength;
        USHORT Reserved;
        union
        {
            struct
            {
                USHORT SubstituteNameOffset;
                USHORT SubstituteNameLength;
                USHORT PrintNameOffset;
                USHORT PrintNameLength;
                ULONG Flags;
                WCHAR PathBuffer[1];
            } SymbolicLinkReparseBuffer;
            struct
            {
                USHORT SubstituteNameOffset;
                USHORT SubstituteNameLength;
                USHORT PrintNameOffset;
                USHORT PrintNameLength;
                WCHAR PathBuffer[1];
            } MountPointReparseBuffer;
            struct
            {
                UCHAR DataBuffer[1];
            } GenericReparseBuffer;
        } DUMMYUNIONNAME;
    } REPARSE_DATA_BUFFER;
#ifndef MAXIMUM_REPARSE_DATA_BUFFER_SIZE
#define MAXIMUM_REPARSE_DATA_BUFFER_SIZE (16 * 1024)
#endif
#endif

    std::shared_ptr<void> file(CreateFileW(GHC_NATIVEWP(p), 0, FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE, 0, OPEN_EXISTING, FILE_FLAG_OPEN_REPARSE_POINT | FILE_FLAG_BACKUP_SEMANTICS, 0), CloseHandle);
    if (file.get() == INVALID_HANDLE_VALUE) {
        ec = detail::make_system_error();
        return path();
    }

    std::shared_ptr<REPARSE_DATA_BUFFER> reparseData((REPARSE_DATA_BUFFER*)std::calloc(1, MAXIMUM_REPARSE_DATA_BUFFER_SIZE), std::free);
    ULONG bufferUsed;
    path result;
    if (DeviceIoControl(file.get(), FSCTL_GET_REPARSE_POINT, 0, 0, reparseData.get(), MAXIMUM_REPARSE_DATA_BUFFER_SIZE, &bufferUsed, 0)) {
        if (IsReparseTagMicrosoft(reparseData->ReparseTag)) {
            switch (reparseData->ReparseTag) {
                case IO_REPARSE_TAG_SYMLINK: {
                    auto printName = std::wstring(&reparseData->SymbolicLinkReparseBuffer.PathBuffer[reparseData->SymbolicLinkReparseBuffer.PrintNameOffset / sizeof(WCHAR)], reparseData->SymbolicLinkReparseBuffer.PrintNameLength / sizeof(WCHAR));
                    auto substituteName =
                        std::wstring(&reparseData->SymbolicLinkReparseBuffer.PathBuffer[reparseData->SymbolicLinkReparseBuffer.SubstituteNameOffset / sizeof(WCHAR)], reparseData->SymbolicLinkReparseBuffer.SubstituteNameLength / sizeof(WCHAR));
                    if (detail::endsWith(substituteName, printName) && detail::startsWith(substituteName, std::wstring(L"\\??\\"))) {
                        result = printName;
                    }
                    else {
                        result = substituteName;
                    }
                    if (reparseData->SymbolicLinkReparseBuffer.Flags & 0x1 /*SYMLINK_FLAG_RELATIVE*/) {
                        result = p.parent_path() / result;
                    }
                    break;
                }
                case IO_REPARSE_TAG_MOUNT_POINT:
                    result = std::wstring(&reparseData->MountPointReparseBuffer.PathBuffer[reparseData->MountPointReparseBuffer.SubstituteNameOffset / sizeof(WCHAR)], reparseData->MountPointReparseBuffer.SubstituteNameLength / sizeof(WCHAR));
                    break;
                default:
                    break;
            }
        }
    }
    else {
        ec = detail::make_system_error();
    }
    return result;
#else
    size_t bufferSize = 256;
    while (true) {
        std::vector<char> buffer(bufferSize, static_cast<char>(0));
        auto rc = ::readlink(p.c_str(), buffer.data(), buffer.size());
        if (rc < 0) {
            ec = detail::make_system_error();
            return path();
        }
        else if (rc < static_cast<int>(bufferSize)) {
            return path(std::string(buffer.data(), static_cast<std::string::size_type>(rc)));
        }
        bufferSize *= 2;
    }
    return path();
#endif
}